

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_seq_flow(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  ro_substr pattern_03;
  csubstr fmt;
  csubstr fmt_00;
  csubstr fmt_01;
  ulong uVar9;
  bool bVar10;
  error_flags eVar11;
  int iVar12;
  Parser *in_RDI;
  char msg_8 [30];
  char msg_7 [30];
  Parser *in_stack_000001a8;
  char msg_6 [31];
  char msg_4 [55];
  bool is_quoted;
  char msg_3 [31];
  char msg_1 [35];
  char msg [31];
  csubstr rem;
  size_t pos_1;
  char msg_5 [58];
  size_t pos;
  char msg_2 [58];
  flag_t in_stack_fffffffffffffb08;
  flag_t in_stack_fffffffffffffb0c;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  basic_substring<const_char> *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  char in_stack_fffffffffffffb37;
  basic_substring<const_char> *in_stack_fffffffffffffb38;
  char *pcVar13;
  size_t in_stack_fffffffffffffb78;
  char *in_stack_fffffffffffffb80;
  pfn_error p_Var14;
  basic_substring<const_char> *in_stack_fffffffffffffb88;
  Parser *in_stack_fffffffffffffb98;
  Parser *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined1 explicit_flow_chars;
  Parser *in_stack_fffffffffffffbc0;
  Parser *in_stack_fffffffffffffbd0;
  Parser *in_stack_fffffffffffffbd8;
  basic_substring<char_const> local_420 [8];
  size_t in_stack_fffffffffffffbe8;
  Parser *in_stack_fffffffffffffbf0;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  size_t local_3e0;
  char local_3d8 [40];
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  Parser *in_stack_fffffffffffffc70;
  char local_388 [40];
  basic_substring<char_const> local_360 [16];
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  basic_substring<const_char> *local_330;
  char local_328 [20];
  flag_t quoted;
  undefined4 in_stack_fffffffffffffcf0;
  undefined2 in_stack_fffffffffffffcf4;
  undefined1 in_stack_fffffffffffffcf6;
  undefined1 in_stack_fffffffffffffcf7;
  csubstr in_stack_fffffffffffffcf8;
  basic_substring<char_const> local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  size_t local_2c0;
  char local_2b8 [64];
  basic_substring<char_const> local_278 [16];
  basic_substring<char_const> local_268 [16];
  char *local_258;
  Parser *local_250;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  basic_substring<const_char> *local_220;
  basic_substring<const_char> local_218;
  char local_208 [40];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  basic_substring<const_char> *local_1c0;
  char local_1b8 [8];
  bool *in_stack_fffffffffffffe50;
  csubstr *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  Parser *in_stack_fffffffffffffe68;
  flag_t local_190;
  flag_t fStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  basic_substring<const_char> *local_170;
  char local_168 [47];
  Parser *this_00;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  basic_substring<const_char> *local_e0;
  char local_d8 [71];
  undefined1 local_91;
  size_t local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  basic_substring<const_char> *local_60;
  char local_58 [40];
  Parser *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8 [15];
  undefined1 in_stack_ffffffffffffffe7;
  
  explicit_flow_chars = (undefined1)((ulong)in_stack_fffffffffffffbb8 >> 0x38);
  quoted = (flag_t)((ulong)stack0xfffffffffffffce8 >> 0x20);
  unique0x00012000 = (in_RDI->m_state->line_contents).rem.str;
  this_00 = (Parser *)(in_RDI->m_state->line_contents).rem.len;
  bVar10 = has_none(in_RDI,0x40);
  if (!bVar10) {
    builtin_strncpy(local_168,"check failed: (has_none(RKEY))",0x1f);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    in_stack_fffffffffffffbc0 = (Parser *)(in_RDI->m_stack).m_callbacks.m_error;
    pcVar13 = local_168;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                       (char *)in_stack_fffffffffffffb28,
                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                       CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                       CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    (*(code *)in_stack_fffffffffffffbc0)(pcVar13,0x1f,(in_RDI->m_stack).m_callbacks.m_user_data);
    explicit_flow_chars = (undefined1)((ulong)pcVar13 >> 0x38);
    in_stack_fffffffffffffb08 = local_190;
    in_stack_fffffffffffffb0c = fStack_18c;
    in_stack_fffffffffffffb10 = uStack_188;
    in_stack_fffffffffffffb14 = uStack_184;
    in_stack_fffffffffffffb18 = local_180;
    in_stack_fffffffffffffb1c = uStack_17c;
    in_stack_fffffffffffffb20 = uStack_178;
    in_stack_fffffffffffffb24 = uStack_174;
    in_stack_fffffffffffffb28 = local_170;
  }
  bVar10 = has_all(in_RDI,0x18);
  if (!bVar10) {
    memcpy(local_1b8,"check failed: (has_all(RSEQ|FLOW))",0x23);
    eVar11 = get_error_flags();
    if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      trap_instruction();
    }
    p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                       (char *)in_stack_fffffffffffffb28,
                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                       CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                       CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    in_stack_fffffffffffffb18 = (undefined4)local_1d0;
    in_stack_fffffffffffffb1c = (undefined4)((ulong)local_1d0 >> 0x20);
    in_stack_fffffffffffffb20 = (undefined4)uStack_1c8;
    in_stack_fffffffffffffb24 = (undefined4)((ulong)uStack_1c8 >> 0x20);
    in_stack_fffffffffffffb08 = (flag_t)local_1e0;
    in_stack_fffffffffffffb0c = (flag_t)((ulong)local_1e0 >> 0x20);
    in_stack_fffffffffffffb10 = (undefined4)uStack_1d8;
    in_stack_fffffffffffffb14 = (undefined4)((ulong)uStack_1d8 >> 0x20);
    LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffffb10;
    LVar1.super_LineCol.offset = local_1e0;
    LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffffb14;
    LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffffb18;
    LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffffb1c;
    LVar1.name.str._0_4_ = in_stack_fffffffffffffb20;
    LVar1.name.str._4_4_ = in_stack_fffffffffffffb24;
    LVar1.name.len = (size_t)local_1c0;
    (*p_Var14)(local_1b8,0x23,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffb28 = local_1c0;
  }
  bVar10 = basic_substring<const_char>::begins_with
                     ((basic_substring<const_char> *)(local_168 + 0x28),' ');
  if (bVar10) {
    bVar10 = basic_substring<const_char>::begins_with(&(in_RDI->m_state->line_contents).rem,' ');
    if (!bVar10) {
      memcpy(local_58,"check failed: (m_state->line_contents.rem.begins_with(c))",0x3a);
      eVar11 = get_error_flags();
      if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        trap_instruction();
      }
      p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                         (char *)in_stack_fffffffffffffb28,
                         CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                         CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                         CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      LVar2.super_LineCol.line._0_4_ = (int)uStack_78;
      LVar2.super_LineCol.offset = local_80;
      LVar2.super_LineCol.line._4_4_ = (int)((ulong)uStack_78 >> 0x20);
      LVar2.super_LineCol.col._0_4_ = (int)local_70;
      LVar2.super_LineCol.col._4_4_ = (int)((ulong)local_70 >> 0x20);
      LVar2.name.str._0_4_ = (int)uStack_68;
      LVar2.name.str._4_4_ = (int)((ulong)uStack_68 >> 0x20);
      LVar2.name.len = (size_t)local_60;
      (*p_Var14)(local_58,0x3a,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffb28 = local_60;
    }
    local_88 = basic_substring<const_char>::first_not_of
                         (in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                          (size_t)in_stack_fffffffffffffb28);
    if (local_88 == 0xffffffffffffffff) {
      local_88 = (in_RDI->m_state->line_contents).rem.len;
    }
    _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  }
  else {
    bVar10 = basic_substring<const_char>::begins_with
                       ((basic_substring<const_char> *)(local_168 + 0x28),'#');
    if (bVar10) {
      _scan_comment(in_stack_fffffffffffffbd8);
    }
    else {
      bVar10 = basic_substring<const_char>::begins_with
                         ((basic_substring<const_char> *)(local_168 + 0x28),']');
      if (bVar10) {
        _pop_level(in_stack_fffffffffffffb98);
        _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        bVar10 = has_all(in_RDI,0x2000);
        if (bVar10) {
          _stop_seqimap(in_stack_fffffffffffffba0);
          _pop_level(in_stack_fffffffffffffb98);
        }
      }
      else {
        bVar10 = has_any(in_RDI,0x80);
        if (bVar10) {
          bVar10 = has_none(in_RDI,0x100);
          if (!bVar10) {
            local_218.str = (char *)0x6166206b63656863;
            local_218.len._0_1_ = 'i';
            local_218.len._1_1_ = 'l';
            local_218.len._2_1_ = 'e';
            local_218.len._3_1_ = 'd';
            local_218.len._4_1_ = ':';
            local_218.len._5_1_ = ' ';
            local_218.len._6_1_ = '(';
            local_218.len._7_1_ = 'h';
            builtin_strncpy(local_208,"as_none(RNXT))",0xf);
            eVar11 = get_error_flags();
            if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              trap_instruction();
            }
            p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
            in_stack_fffffffffffffb88 = &local_218;
            Location::Location((Location *)
                               CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                               (char *)in_stack_fffffffffffffb28,
                               CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                               CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
            in_stack_fffffffffffffb18 = (undefined4)local_230;
            in_stack_fffffffffffffb1c = (undefined4)((ulong)local_230 >> 0x20);
            in_stack_fffffffffffffb20 = (undefined4)uStack_228;
            in_stack_fffffffffffffb24 = (undefined4)((ulong)uStack_228 >> 0x20);
            in_stack_fffffffffffffb08 = (flag_t)local_240;
            in_stack_fffffffffffffb0c = (flag_t)((ulong)local_240 >> 0x20);
            in_stack_fffffffffffffb10 = (undefined4)uStack_238;
            in_stack_fffffffffffffb14 = (undefined4)((ulong)uStack_238 >> 0x20);
            LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffffb10;
            LVar3.super_LineCol.offset = local_240;
            LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffffb14;
            LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffffb18;
            LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffffb1c;
            LVar3.name.str._0_4_ = in_stack_fffffffffffffb20;
            LVar3.name.str._4_4_ = in_stack_fffffffffffffb24;
            LVar3.name.len = (size_t)local_220;
            (*p_Var14)((char *)in_stack_fffffffffffffb88,0x1f,LVar3,
                       (in_RDI->m_stack).m_callbacks.m_user_data);
            in_stack_fffffffffffffb28 = local_220;
          }
          bVar10 = _scan_scalar_seq_flow
                             ((Parser *)
                              CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                              in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          if (bVar10) {
            local_250 = this_00;
            addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                         in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
            local_258 = stack0xfffffffffffffec0;
            _append_val((Parser *)
                        CONCAT17(in_stack_fffffffffffffcf7,
                                 CONCAT16(in_stack_fffffffffffffcf6,
                                          CONCAT24(in_stack_fffffffffffffcf4,
                                                   in_stack_fffffffffffffcf0))),
                        in_stack_fffffffffffffcf8,quoted);
          }
          else {
            bVar10 = basic_substring<const_char>::begins_with
                               ((basic_substring<const_char> *)(local_168 + 0x28),'[');
            if (bVar10) {
              addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
              _push_level(in_stack_fffffffffffffbc0,(bool)explicit_flow_chars);
              pcVar13 = stack0xfffffffffffffec0;
              uVar9 = (ulong)stack0xfffffffffffffec0 >> 0x38;
              bVar10 = SUB81(uVar9,0);
              unique0x1000271e = pcVar13;
              _start_seq(this_00,bVar10);
              add_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                        in_stack_fffffffffffffb0c);
              _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            }
            else {
              bVar10 = basic_substring<const_char>::begins_with
                                 ((basic_substring<const_char> *)(local_168 + 0x28),'{');
              if (bVar10) {
                addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                             ,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
                _push_level(in_stack_fffffffffffffbc0,(bool)explicit_flow_chars);
                _start_map(in_stack_fffffffffffffe68,(bool)in_stack_fffffffffffffe67);
                addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                             ,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
                _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
              }
              else {
                iVar12 = basic_substring<const_char>::compare
                                   (in_stack_fffffffffffffb28,
                                    (char)((uint)in_stack_fffffffffffffb24 >> 0x18));
                if (iVar12 == 0) {
                  _start_seqimap(in_stack_fffffffffffffbf0);
                  _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                }
                else {
                  basic_substring<char_const>::basic_substring<3ul>
                            (local_268,(char (*) [3])0x346f63);
                  pattern.str._7_1_ = in_stack_fffffffffffffb37;
                  pattern.str._0_7_ = in_stack_fffffffffffffb30;
                  pattern.len = (size_t)in_stack_fffffffffffffb38;
                  bVar10 = basic_substring<const_char>::begins_with
                                     (in_stack_fffffffffffffb28,pattern);
                  if (bVar10) {
                    _start_seqimap(in_stack_fffffffffffffbf0);
                    _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                  }
                  else {
                    basic_substring<char_const>::basic_substring<3ul>(local_278,(char (*) [3])"? ");
                    pattern_00.str._7_1_ = in_stack_fffffffffffffb37;
                    pattern_00.str._0_7_ = in_stack_fffffffffffffb30;
                    pattern_00.len = (size_t)in_stack_fffffffffffffb38;
                    bVar10 = basic_substring<const_char>::begins_with
                                       (in_stack_fffffffffffffb28,pattern_00);
                    if (bVar10) {
                      _start_seqimap(in_stack_fffffffffffffbf0);
                      _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                      bVar10 = has_any(in_RDI,0x200);
                      if ((!bVar10) ||
                         (iVar12 = basic_substring<const_char>::compare
                                             (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                                              in_stack_fffffffffffffb78), iVar12 != 0)) {
                        memcpy(local_2b8,"check failed: (has_any(SSCL) && m_state->scalar == \"\")",
                               0x37);
                        eVar11 = get_error_flags();
                        if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                          trap_instruction();
                        }
                        p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
                        pcVar13 = local_2b8;
                        Location::Location((Location *)
                                           CONCAT17(in_stack_fffffffffffffb37,
                                                    in_stack_fffffffffffffb30),
                                           (char *)in_stack_fffffffffffffb28,
                                           CONCAT44(in_stack_fffffffffffffb24,
                                                    in_stack_fffffffffffffb20),
                                           CONCAT44(in_stack_fffffffffffffb1c,
                                                    in_stack_fffffffffffffb18),
                                           CONCAT44(in_stack_fffffffffffffb14,
                                                    in_stack_fffffffffffffb10));
                        in_stack_fffffffffffffb08 = (flag_t)local_2e0;
                        in_stack_fffffffffffffb0c = (flag_t)((ulong)local_2e0 >> 0x20);
                        in_stack_fffffffffffffb10 = (undefined4)uStack_2d8;
                        in_stack_fffffffffffffb14 = (undefined4)((ulong)uStack_2d8 >> 0x20);
                        LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffffb10;
                        LVar4.super_LineCol.offset = local_2e0;
                        LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffffb14;
                        LVar4.super_LineCol.col._0_4_ = (int)local_2d0;
                        LVar4.super_LineCol.col._4_4_ = (int)((ulong)local_2d0 >> 0x20);
                        LVar4.name.str._0_4_ = (int)uStack_2c8;
                        LVar4.name.str._4_4_ = (int)((ulong)uStack_2c8 >> 0x20);
                        LVar4.name.len = local_2c0;
                        (*p_Var14)(pcVar13,0x37,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
                      }
                      addrem_flags((Parser *)
                                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                   in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
                    }
                    else {
                      bVar10 = _handle_types(in_stack_000001a8);
                      if ((!bVar10) &&
                         (bVar10 = _handle_val_anchors_and_refs(in_stack_fffffffffffffc70), !bVar10)
                         ) {
                        basic_substring<char_const>::basic_substring<3ul>
                                  (local_2f0,(char (*) [3])0x346d28);
                        pattern_01.str._7_1_ = in_stack_fffffffffffffb37;
                        pattern_01.str._0_7_ = in_stack_fffffffffffffb30;
                        pattern_01.len = (size_t)in_stack_fffffffffffffb38;
                        bVar10 = basic_substring<const_char>::begins_with
                                           (in_stack_fffffffffffffb28,pattern_01);
                        if (bVar10) {
                          _append_val_null(in_stack_fffffffffffffbd0,(char *)in_RDI);
                          _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                        }
                        else {
                          bVar10 = basic_substring<const_char>::begins_with
                                             ((basic_substring<const_char> *)(local_168 + 0x28),',')
                          ;
                          if (bVar10) {
                            _append_val_null(in_stack_fffffffffffffbd0,(char *)in_RDI);
                            _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                          }
                          else {
                            bVar10 = basic_substring<const_char>::begins_with
                                               ((basic_substring<const_char> *)(local_168 + 0x28),
                                                '\t');
                            if (bVar10) {
                              local_91 = 9;
                              bVar10 = basic_substring<const_char>::begins_with
                                                 (&(in_RDI->m_state->line_contents).rem,'\t');
                              if (!bVar10) {
                                memcpy(local_d8,
                                       "check failed: (m_state->line_contents.rem.begins_with(c))",
                                       0x3a);
                                eVar11 = get_error_flags();
                                if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)
                                   ) {
                                  trap_instruction();
                                }
                                p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
                                Location::Location((Location *)
                                                   CONCAT17(in_stack_fffffffffffffb37,
                                                            in_stack_fffffffffffffb30),
                                                   (char *)in_stack_fffffffffffffb28,
                                                   CONCAT44(in_stack_fffffffffffffb24,
                                                            in_stack_fffffffffffffb20),
                                                   CONCAT44(in_stack_fffffffffffffb1c,
                                                            in_stack_fffffffffffffb18),
                                                   CONCAT44(in_stack_fffffffffffffb14,
                                                            in_stack_fffffffffffffb10));
                                LVar5.super_LineCol.line._0_4_ = (int)uStack_f8;
                                LVar5.super_LineCol.offset = local_100;
                                LVar5.super_LineCol.line._4_4_ = (int)((ulong)uStack_f8 >> 0x20);
                                LVar5.super_LineCol.col._0_4_ = (int)local_f0;
                                LVar5.super_LineCol.col._4_4_ = (int)((ulong)local_f0 >> 0x20);
                                LVar5.name.str._0_4_ = (int)uStack_e8;
                                LVar5.name.str._4_4_ = (int)((ulong)uStack_e8 >> 0x20);
                                LVar5.name.len = (size_t)local_e0;
                                (*p_Var14)(local_d8,0x3a,LVar5,
                                           (in_RDI->m_stack).m_callbacks.m_user_data);
                                in_stack_fffffffffffffb28 = local_e0;
                              }
                              basic_substring<const_char>::first_not_of
                                        (in_stack_fffffffffffffb38,in_stack_fffffffffffffb37,
                                         (size_t)in_stack_fffffffffffffb28);
                              _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                            }
                            else {
                              bVar10 = is_debugger_attached();
                              if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
                                trap_instruction();
                              }
                              basic_substring<char_const>::basic_substring<19ul>
                                        ((basic_substring<char_const> *)&stack0xfffffffffffffd00,
                                         (char (*) [19])"ERROR: parse error");
                              fmt.len._7_1_ = in_stack_ffffffffffffffe7;
                              fmt._0_15_ = in_stack_ffffffffffffffd8;
                              _err<>(in_stack_ffffffffffffffd0,fmt);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          bVar10 = has_any(in_RDI,0x100);
          if (bVar10) {
            bVar10 = has_none(in_RDI,0x80);
            if (!bVar10) {
              builtin_strncpy(local_328,"check failed: (h",0x10);
              eVar11 = get_error_flags();
              if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                trap_instruction();
              }
              p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
              Location::Location((Location *)
                                 CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                                 (char *)in_stack_fffffffffffffb28,
                                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                 CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
              in_stack_fffffffffffffb18 = (undefined4)local_340;
              in_stack_fffffffffffffb1c = (undefined4)((ulong)local_340 >> 0x20);
              in_stack_fffffffffffffb20 = (undefined4)uStack_338;
              in_stack_fffffffffffffb24 = (undefined4)((ulong)uStack_338 >> 0x20);
              in_stack_fffffffffffffb08 = (flag_t)local_350;
              in_stack_fffffffffffffb0c = (flag_t)((ulong)local_350 >> 0x20);
              in_stack_fffffffffffffb10 = (undefined4)uStack_348;
              in_stack_fffffffffffffb14 = (undefined4)((ulong)uStack_348 >> 0x20);
              LVar6.super_LineCol.line._0_4_ = in_stack_fffffffffffffb10;
              LVar6.super_LineCol.offset = local_350;
              LVar6.super_LineCol.line._4_4_ = in_stack_fffffffffffffb14;
              LVar6.super_LineCol.col._0_4_ = in_stack_fffffffffffffb18;
              LVar6.super_LineCol.col._4_4_ = in_stack_fffffffffffffb1c;
              LVar6.name.str._0_4_ = in_stack_fffffffffffffb20;
              LVar6.name.str._4_4_ = in_stack_fffffffffffffb24;
              LVar6.name.len = (size_t)local_330;
              (*p_Var14)(local_328,0x1f,LVar6,(in_RDI->m_stack).m_callbacks.m_user_data);
              in_stack_fffffffffffffb28 = local_330;
            }
            basic_substring<char_const>::basic_substring<3ul>(local_360,(char (*) [3])0x346d28);
            pattern_02.str._7_1_ = in_stack_fffffffffffffb37;
            pattern_02.str._0_7_ = in_stack_fffffffffffffb30;
            pattern_02.len = (size_t)in_stack_fffffffffffffb38;
            bVar10 = basic_substring<const_char>::begins_with(in_stack_fffffffffffffb28,pattern_02);
            if (bVar10) {
              bVar10 = has_all(in_RDI,0x10);
              if (!bVar10) {
                builtin_strncpy(local_388,"check failed: (has_all(FLOW))",0x1e);
                eVar11 = get_error_flags();
                if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                  trap_instruction();
                }
                p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
                Location::Location((Location *)
                                   CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                                   (char *)in_stack_fffffffffffffb28,
                                   CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                   CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
                in_stack_fffffffffffffb08 = (flag_t)local_3b0;
                in_stack_fffffffffffffb0c = (flag_t)((ulong)local_3b0 >> 0x20);
                in_stack_fffffffffffffb10 = (undefined4)uStack_3a8;
                in_stack_fffffffffffffb14 = (undefined4)((ulong)uStack_3a8 >> 0x20);
                LVar7.super_LineCol.line._0_4_ = in_stack_fffffffffffffb10;
                LVar7.super_LineCol.offset = local_3b0;
                LVar7.super_LineCol.line._4_4_ = in_stack_fffffffffffffb14;
                LVar7.super_LineCol.col._0_4_ = (int)local_3a0;
                LVar7.super_LineCol.col._4_4_ = (int)((ulong)local_3a0 >> 0x20);
                LVar7.name.str._0_4_ = (int)uStack_398;
                LVar7.name.str._4_4_ = (int)((ulong)uStack_398 >> 0x20);
                LVar7.name.len = (size_t)in_stack_fffffffffffffc70;
                (*p_Var14)(local_388,0x1e,LVar7,(in_RDI->m_stack).m_callbacks.m_user_data);
              }
              addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                           in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
              _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            }
            else {
              bVar10 = basic_substring<const_char>::begins_with
                                 ((basic_substring<const_char> *)(local_168 + 0x28),',');
              if (bVar10) {
                bVar10 = has_all(in_RDI,0x10);
                if (!bVar10) {
                  builtin_strncpy(local_3d8,"check failed: (has_all(FLOW))",0x1e);
                  eVar11 = get_error_flags();
                  if (((eVar11 & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                    trap_instruction();
                  }
                  p_Var14 = (in_RDI->m_stack).m_callbacks.m_error;
                  pcVar13 = local_3d8;
                  Location::Location((Location *)
                                     CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                                     (char *)in_stack_fffffffffffffb28,
                                     CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                     CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                                     CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
                  in_stack_fffffffffffffb08 = (flag_t)local_400;
                  in_stack_fffffffffffffb0c = (flag_t)((ulong)local_400 >> 0x20);
                  in_stack_fffffffffffffb10 = (undefined4)uStack_3f8;
                  in_stack_fffffffffffffb14 = (undefined4)((ulong)uStack_3f8 >> 0x20);
                  LVar8.super_LineCol.line._0_4_ = in_stack_fffffffffffffb10;
                  LVar8.super_LineCol.offset = local_400;
                  LVar8.super_LineCol.line._4_4_ = in_stack_fffffffffffffb14;
                  LVar8.super_LineCol.col._0_4_ = (int)local_3f0;
                  LVar8.super_LineCol.col._4_4_ = (int)((ulong)local_3f0 >> 0x20);
                  LVar8.name.str._0_4_ = (int)uStack_3e8;
                  LVar8.name.str._4_4_ = (int)((ulong)uStack_3e8 >> 0x20);
                  LVar8.name.len = local_3e0;
                  (*p_Var14)(pcVar13,0x1e,LVar8,(in_RDI->m_stack).m_callbacks.m_user_data);
                }
                addrem_flags((Parser *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
                             ,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
                _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
              }
              else {
                iVar12 = basic_substring<const_char>::compare
                                   (in_stack_fffffffffffffb28,
                                    (char)((uint)in_stack_fffffffffffffb24 >> 0x18));
                if (iVar12 == 0) {
                  _start_seqimap(in_stack_fffffffffffffbf0);
                  _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                }
                else {
                  basic_substring<char_const>::basic_substring<3ul>
                            ((basic_substring<char_const> *)&stack0xfffffffffffffbf0,
                             (char (*) [3])0x346f63);
                  pattern_03.str._7_1_ = in_stack_fffffffffffffb37;
                  pattern_03.str._0_7_ = in_stack_fffffffffffffb30;
                  pattern_03.len = (size_t)in_stack_fffffffffffffb38;
                  bVar10 = basic_substring<const_char>::begins_with
                                     (in_stack_fffffffffffffb28,pattern_03);
                  if (bVar10) {
                    _start_seqimap(in_stack_fffffffffffffbf0);
                    _line_progressed(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
                  }
                  else {
                    bVar10 = is_debugger_attached();
                    if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
                      trap_instruction();
                    }
                    basic_substring<char_const>::basic_substring<29ul>
                              (local_420,(char (*) [29])"ERROR: was expecting a comma");
                    fmt_00.len._7_1_ = in_stack_ffffffffffffffe7;
                    fmt_00._0_15_ = in_stack_ffffffffffffffd8;
                    _err<>(in_stack_ffffffffffffffd0,fmt_00);
                  }
                }
              }
            }
          }
          else {
            bVar10 = is_debugger_attached();
            if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
              trap_instruction();
            }
            basic_substring<char_const>::basic_substring<22ul>
                      ((basic_substring<char_const> *)&stack0xfffffffffffffbd0,
                       (char (*) [22])"ERROR: internal error");
            fmt_01.len._7_1_ = in_stack_ffffffffffffffe7;
            fmt_01._0_15_ = in_stack_ffffffffffffffd8;
            _err<>(in_stack_ffffffffffffffd0,fmt_01);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Parser::_handle_seq_flow()
{
    _c4dbgpf("handle_seq_flow: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with(']'))
    {
        _c4dbgp("end the sequence");
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        bool is_quoted;
        if(_scan_scalar_seq_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL);
            _append_val(rem, is_quoted);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgpf("found '? ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(SSCL) && m_state->scalar == "");
            addrem_flags(QMRK|RKEY, RVAL|SSCL);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(", "))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('\t'))
        {
            _skipchars('\t');
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        if(rem.begins_with(", "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else
        {
            _c4err("was expecting a comma");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return true;
}